

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mips.cpp
# Opt level: O2

void __thiscall CMipsArchitecture::CMipsArchitecture(CMipsArchitecture *this)

{
  (this->super_CArchitecture)._vptr_CArchitecture = (_func_int **)&PTR_AssembleOpcode_00178fe0;
  this->FixLoadDelay = false;
  this->IgnoreLoadDelay = false;
  this->LoadDelay = false;
  this->LoadDelayRegister = 0;
  this->DelaySlot = false;
  this->Version = MARCH_INVALID;
  return;
}

Assistant:

CMipsArchitecture::CMipsArchitecture()
{
	FixLoadDelay = false;
	IgnoreLoadDelay = false;
	LoadDelay = false;
	LoadDelayRegister = 0;
	DelaySlot = false;
	Version = MARCH_INVALID;
}